

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

size_t CountPSBTUnsignedInputs(PartiallySignedTransaction *psbt)

{
  uint uVar1;
  size_t sVar2;
  PSBTInput *input;
  pointer pPVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  sVar2 = 0;
  for (pPVar3 = (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar3 != (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                super__Vector_impl_data._M_finish; pPVar3 = pPVar3 + 1) {
    uVar1 = (pPVar3->final_script_sig).super_CScriptBase._size;
    uVar4 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar4 = uVar1;
    }
    sVar2 = sVar2 + ((pPVar3->final_script_witness).stack.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start ==
                     (pPVar3->final_script_witness).stack.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish && uVar4 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t CountPSBTUnsignedInputs(const PartiallySignedTransaction& psbt) {
    size_t count = 0;
    for (const auto& input : psbt.inputs) {
        if (!PSBTInputSigned(input)) {
            count++;
        }
    }

    return count;
}